

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# float_test.cpp
# Opt level: O0

void __thiscall
FloatingPoint_DoubleBits_Test::FloatingPoint_DoubleBits_Test(FloatingPoint_DoubleBits_Test *this)

{
  undefined8 *in_RDI;
  Test *unaff_retaddr;
  
  testing::Test::Test(unaff_retaddr);
  *in_RDI = &PTR__FloatingPoint_DoubleBits_Test_03741cd8;
  return;
}

Assistant:

TEST(FloatingPoint, DoubleBits) {
    RNG rng(2);
    for (int i = 0; i < 100000; ++i) {
        uint64_t ui = (uint64_t(rng.Uniform<uint32_t>()) |
                       (uint64_t(rng.Uniform<uint32_t>()) << 32));
        double f = BitsToFloat(ui);

        if (std::isnan(f))
            continue;

        EXPECT_EQ(ui, FloatToBits(f));
    }
}